

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lalr.c
# Opt level: O3

void set_maxrhs(void)

{
  int iVar1;
  Yshort *pYVar2;
  int iVar3;
  
  if ((long)nitems < 1) {
    maxrhs = 0;
  }
  else {
    maxrhs = 0;
    iVar3 = 0;
    pYVar2 = ritem;
    do {
      iVar1 = iVar3;
      if (iVar3 <= maxrhs) {
        iVar1 = maxrhs;
      }
      iVar3 = iVar3 + 1;
      if (*pYVar2 < 0) {
        iVar3 = 0;
        maxrhs = iVar1;
      }
      pYVar2 = pYVar2 + 1;
    } while (pYVar2 < ritem + nitems);
  }
  return;
}

Assistant:

void set_maxrhs()
{
  register Yshort *itemp;
  register Yshort *item_end;
  register int length;
  register int max;

  length = 0;
  max = 0;
  item_end = ritem + nitems;
  for (itemp = ritem; itemp < item_end; itemp++)
    {
      if (*itemp >= 0)
	{
	  length++;
	}
      else
	{
	  if (length > max) max = length;
	  length = 0;
	}
    }

  maxrhs = max;
}